

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter,double width)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uchar *puVar9;
  ImPlotPlot *pIVar10;
  double dVar11;
  double dVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  ImU32 col;
  ImU32 col_00;
  long lVar15;
  ImDrawList *this;
  int iVar16;
  int iVar17;
  int iVar18;
  ImPlotRange *pIVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar16 = getter->Count, 0 < iVar16)) {
      puVar8 = getter->Xs;
      puVar9 = getter->Ys;
      iVar18 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar5 = pIVar10->CurrentYAxis;
      uVar6 = (pIVar10->XAxis).Flags;
      pIVar19 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar10->YAxis[iVar5].Flags;
      iVar17 = 0;
      do {
        lVar15 = (long)(((iVar18 + iVar17) % iVar16 + iVar16) % iVar16) * (long)iVar4;
        bVar1 = puVar8[lVar15];
        bVar2 = puVar9[lVar15];
        dVar22 = (double)bVar2;
        dVar23 = (double)bVar1 - dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar23) < 0x7ff0000000000000) {
LAB_001f3052:
            if ((0.0 < dVar23) || ((uVar6 & 0x20) == 0)) {
              dVar11 = (pIVar13->ExtentsX).Min;
              dVar12 = (pIVar13->ExtentsX).Max;
              uVar20 = -(ulong)(dVar23 < dVar11);
              uVar21 = -(ulong)(dVar12 < dVar23);
              (pIVar13->ExtentsX).Min = (double)(~uVar20 & (ulong)dVar11 | (ulong)dVar23 & uVar20);
              (pIVar13->ExtentsX).Max = (double)(~uVar21 & (ulong)dVar12 | (ulong)dVar23 & uVar21);
            }
          }
        }
        else if ((((long)ABS(dVar23) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar5].Range.Min <= dVar22)) &&
                (dVar22 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f3052;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((bVar2 != 0) || ((uVar7 & 0x20) == 0)) {
LAB_001f30cf:
            dVar23 = pIVar13->ExtentsY[iVar5].Max;
            uVar20 = -(ulong)(dVar22 < pIVar19->Min);
            uVar21 = -(ulong)(dVar23 < dVar22);
            pIVar19->Min = (double)(~uVar20 & (ulong)pIVar19->Min | (ulong)dVar22 & uVar20);
            pIVar13->ExtentsY[iVar5].Max =
                 (double)(~uVar21 & (ulong)dVar23 | (ulong)dVar22 & uVar21);
          }
        }
        else if ((((pIVar10->XAxis).Range.Min <= dVar23) && (dVar23 <= (pIVar10->XAxis).Range.Max))
                && (local_48 = (byte)((uVar7 & 0x20) >> 5), (bVar2 == 0 & local_48) == 0))
        goto LAB_001f30cf;
        dVar22 = (double)bVar1 + dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f3137:
            if ((0.0 < dVar22) || ((uVar6 & 0x20) == 0)) {
              dVar23 = (pIVar13->ExtentsX).Min;
              dVar11 = (pIVar13->ExtentsX).Max;
              uVar20 = -(ulong)(dVar22 < dVar23);
              uVar21 = -(ulong)(dVar11 < dVar22);
              (pIVar13->ExtentsX).Min = (double)(~uVar20 & (ulong)dVar23 | (ulong)dVar22 & uVar20);
              (pIVar13->ExtentsX).Max = (double)(~uVar21 & (ulong)dVar11 | (ulong)dVar22 & uVar21);
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar5].Range.Min <= 0.0)) &&
                (0.0 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f3137;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar7 & 0x20) == 0) {
LAB_001f31aa:
            dVar22 = (*pIVar19).Min;
            dVar23 = (*pIVar19).Max;
            pIVar19->Min = (double)(-(ulong)(dVar22 <= 0.0) & (ulong)dVar22);
            pIVar13->ExtentsY[iVar5].Max = (double)(-(ulong)(0.0 <= dVar23) & (ulong)dVar23);
          }
        }
        else if ((((uVar7 & 0x20) == 0) && ((pIVar10->XAxis).Range.Min <= dVar22)) &&
                (dVar22 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f31aa;
        iVar17 = iVar17 + 1;
      } while (iVar16 != iVar17);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar13->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
    iVar16 = getter->Count;
    if (0 < iVar16) {
      bVar14 = (pIVar13->NextItemData).RenderFill;
      bVar3 = (pIVar13->NextItemData).RenderLine;
      iVar18 = 0;
      do {
        lVar15 = (long)(((getter->Offset + iVar18) % iVar16 + iVar16) % iVar16) *
                 (long)getter->Stride;
        if (getter->Ys[lVar15] != 0) {
          bVar1 = getter->Xs[lVar15];
          local_38 = PlotToPixels((double)bVar1 - dVar24,(double)getter->Ys[lVar15],-1);
          local_40 = PlotToPixels((double)bVar1 + dVar24,0.0,-1);
          if ((pIVar13->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar14 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar13->NextItemData).LineWeight);
          }
          iVar16 = getter->Count;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar16);
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}